

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O2

Error __thiscall asmjit::X86RAPass::annotate(X86RAPass *this)

{
  CodeBuilder *pCVar1;
  CCFunc *pCVar2;
  CodeBuilder *emitter;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  CBInst *node;
  CCFunc *pCVar5;
  StringBuilderTmp<256UL> sb;
  
  pCVar5 = (this->super_RAPass)._func;
  sb.super_StringBuilder._data = sb._embeddedData;
  pCVar1 = (this->super_RAPass).super_CBPass._cb;
  uVar4 = 0;
  pCVar2 = (CCFunc *)pCVar5->_end;
  sb._embeddedData[0] = '\0';
  sb.super_StringBuilder._length = 0;
  sb.super_StringBuilder._capacity = 0x100;
  sb.super_StringBuilder._canFree = 0;
  for (; (pCVar5 != (CCFunc *)0x0 && (pCVar5 != pCVar2));
      pCVar5 = (CCFunc *)(pCVar5->super_CBLabel).super_CBNode._next) {
    if (((pCVar5->super_CBLabel).super_CBNode._inlineComment == (char *)0x0) &&
       ((pCVar5->super_CBLabel).super_CBNode._type == '\x01')) {
      emitter = (this->super_RAPass).super_CBPass._cb;
      Logging::formatInstruction
                (&sb.super_StringBuilder,0,&emitter->super_CodeEmitter,
                 (uint)(emitter->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,
                 (Detail *)&(pCVar5->super_CBLabel)._id,
                 (Operand_ *)(pCVar5->_funcDetail)._callConv._passedOrder[0],
                 (uint)(pCVar5->super_CBLabel).super_CBNode._opCount);
      iVar3 = Zone::dup(&pCVar1->_cbDataZone,(int)sb.super_StringBuilder._data);
      (pCVar5->super_CBLabel).super_CBNode._inlineComment = (char *)CONCAT44(extraout_var,iVar3);
      if (uVar4 <= (uint)sb.super_StringBuilder._length) {
        uVar4 = (uint)sb.super_StringBuilder._length;
      }
      StringBuilder::clear(&sb.super_StringBuilder);
    }
  }
  (this->super_RAPass)._annotationLength = uVar4 + 1;
  StringBuilder::~StringBuilder(&sb.super_StringBuilder);
  return 0;
}

Assistant:

Error X86RAPass::annotate() {
#if !defined(ASMJIT_DISABLE_LOGGING)
  CCFunc* func = getFunc();

  CBNode* node_ = func;
  CBNode* end = func->getEnd();

  Zone& dataZone = cc()->_cbDataZone;
  StringBuilderTmp<256> sb;

  uint32_t maxLen = 0;
  while (node_ && node_ != end) {
    if (!node_->hasInlineComment()) {
      if (node_->getType() == CBNode::kNodeInst) {
        CBInst* node = static_cast<CBInst*>(node_);
        Logging::formatInstruction(
          sb,
          0,
          cc(),
          cc()->getArchType(),
          node->getInstDetail(), node->getOpArray(), node->getOpCount());

        node_->setInlineComment(
          static_cast<char*>(dataZone.dup(sb.getData(), sb.getLength(), true)));
        maxLen = std::max<uint32_t>(maxLen, static_cast<uint32_t>(sb.getLength()));

        sb.clear();
      }
    }

    node_ = node_->getNext();
  }
  _annotationLength = maxLen + 1;
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}